

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

Score * __thiscall xLearn::Solver::create_score(Solver *this)

{
  char *pcVar1;
  ostream *poVar2;
  ObjectCreatorRegistry_xLearn_score_registry *in_RDI;
  Score *score;
  allocator *this_00;
  string *in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  LogSeverity in_stack_ffffffffffffffb4;
  Logger local_48 [5];
  allocator local_31;
  string local_30 [32];
  Score *local_10;
  
  GetRegistry_xLearn_score_registry();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  local_10 = ObjectCreatorRegistry_xLearn_score_registry::CreateObject
                       (in_RDI,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (local_10 == (Score *)0x0) {
    Logger::Logger(local_48,FATAL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff98,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_69);
    this_00 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"create_score",this_00);
    poVar2 = Logger::Start(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
    poVar2 = std::operator<<(poVar2,"Cannot create score: ");
    std::operator<<(poVar2,(string *)&in_RDI->m_creator_registry);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    Logger::~Logger((Logger *)this_00);
  }
  return local_10;
}

Assistant:

Score* Solver::create_score() {
  Score* score;
  score = CREATE_SCORE(hyper_param_.score_func.c_str());
  if (score == nullptr) {
    LOG(FATAL) << "Cannot create score: "
               << hyper_param_.score_func;
  }
  return score;
}